

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

int32_t __thiscall
helics::CommonCore::getHandleOption(CommonCore *this,InterfaceHandle handle,int32_t option)

{
  int32_t iVar1;
  pair<helics::route_id,_helics::ActionMessage> *ppVar2;
  FederateState *this_00;
  int in_EDX;
  int32_t in_ESI;
  undefined8 in_RDI;
  LocalFederateId federateID;
  FederateState *fed;
  pair<helics::route_id,_helics::ActionMessage> *handleInfo;
  CommonCore *in_stack_ffffffffffffffa8;
  InterfaceHandle in_stack_ffffffffffffffb4;
  char iType;
  anon_class_8_2_b118ba6a *in_stack_ffffffffffffffc8;
  InterfaceHandle in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  type_conflict2 local_4;
  
  federateID.fid = (BaseType)((ulong)in_RDI >> 0x20);
  ppVar2 = getHandleInfo(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb4);
  if (ppVar2 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    local_4 = 0;
  }
  else if ((in_EDX == 0x18d) || (in_EDX == 0x192)) {
    local_4 = gmlc::libguarded::ordered_guarded<helics::HandleManager,std::shared_mutex>::
              read<helics::CommonCore::getHandleOption(helics::InterfaceHandle,int)const::__0>
                        ((ordered_guarded<helics::HandleManager,_std::shared_mutex> *)
                         CONCAT44(in_ESI,in_stack_ffffffffffffffd0.hid),in_stack_ffffffffffffffc8);
  }
  else {
    if ((char)(ppVar2->second).messageID != 'f') {
      iType = (char)((uint)(ppVar2->second).messageAction >> 0x18);
      this_00 = getFederateAt((CommonCore *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),federateID);
      if (this_00 != (FederateState *)0x0) {
        iVar1 = FederateState::getHandleOption(this_00,in_stack_ffffffffffffffd0,iType,in_ESI);
        return iVar1;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int32_t CommonCore::getHandleOption(InterfaceHandle handle, int32_t option) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        return 0;
    }
    switch (option) {
        case defs::Options::CONNECTION_REQUIRED:
        case defs::Options::CONNECTION_OPTIONAL:
            return handles.read(
                [handle, option](auto& hand) { return hand.getHandleOption(handle, option); });
        default:
            break;
    }
    if (handleInfo->handleType != InterfaceType::FILTER) {
        auto* fed = getFederateAt(handleInfo->local_fed_id);
        if (fed != nullptr) {
            return fed->getHandleOption(handle, static_cast<char>(handleInfo->handleType), option);
        }
    } else {
        // must be for filter
    }
    return 0;
}